

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepbitfield(rnndb *db,rnnbitfield *bf,char *prefix,rnnvarinfo *parvi)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RDX;
  long in_RSI;
  char *in_RDI;
  int unaff_retaddr;
  rnnvarinfo *in_stack_00000038;
  rnnvarinfo *in_stack_00000040;
  char *in_stack_00000048;
  rnndb *in_stack_00000050;
  
  pcVar1 = catstr(in_RDX,in_RCX);
  *(char **)(in_RSI + 0xd0) = pcVar1;
  prepvarinfo(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if (*(int *)(in_RSI + 0x30) == 0) {
    if (*(int *)(in_RSI + 0xc) == 0x3f) {
      *(long *)(in_RSI + 0x10) = -(1L << ((byte)*(undefined4 *)(in_RSI + 8) & 0x3f));
    }
    else {
      *(long *)(in_RSI + 0x10) =
           (1L << ((char)*(undefined4 *)(in_RSI + 0xc) + 1U & 0x3f)) -
           (1L << ((byte)*(undefined4 *)(in_RSI + 8) & 0x3f));
    }
    preptypeinfo(db,(rnntypeinfo *)bf,prefix,parvi,unaff_retaddr,in_RDI);
    if (*(long *)(in_RSI + 0x40) != 0) {
      pcVar1 = catstr(in_RDX,in_RCX);
      *(char **)(in_RSI + 0xd0) = pcVar1;
    }
  }
  return;
}

Assistant:

static void prepbitfield(struct rnndb *db, struct rnnbitfield *bf, char *prefix, struct rnnvarinfo *parvi) {
	bf->fullname = catstr(prefix, bf->name);
	prepvarinfo (db, bf->fullname, &bf->varinfo, parvi);
	if (bf->varinfo.dead)
		return;
	if (bf->high == 63)
		bf->mask = - (1ULL<<bf->low);
	else
		bf->mask = (1ULL<<(bf->high+1)) - (1ULL<<bf->low);
	preptypeinfo(db, &bf->typeinfo, bf->fullname, &bf->varinfo, bf->high - bf->low + 1, bf->file);
	if (bf->varinfo.prefix)
		bf->fullname = catstr(bf->varinfo.prefix, bf->fullname);
}